

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImFontAtlas::CustomRectRegister(ImFontAtlas *this,uint id,int width,int height)

{
  undefined1 local_28 [8];
  CustomRect r;
  int height_local;
  int width_local;
  uint id_local;
  ImFontAtlas *this_local;
  
  r._4_4_ = height;
  r._8_4_ = width;
  if (width < 1 || 0xffff < width) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x529,"int ImFontAtlas::CustomRectRegister(unsigned int, int, int)");
  }
  if (height < 1 || 0xffff < height) {
    __assert_fail("height > 0 && height <= 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x52a,"int ImFontAtlas::CustomRectRegister(unsigned int, int, int)");
  }
  CustomRect::CustomRect((CustomRect *)local_28);
  local_28._4_2_ = r.X;
  local_28._6_2_ = r.Width;
  local_28._0_4_ = id;
  ImVector<ImFontAtlas::CustomRect>::push_back(&this->CustomRects,(value_type *)local_28);
  return (this->CustomRects).Size + -1;
}

Assistant:

int ImFontAtlas::CustomRectRegister(unsigned int id, int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}